

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O2

void anon_unknown.dwarf_38a::printCompdb(char *directory,Edge *edge,EvaluateCommandMode eval_mode)

{
  long lVar1;
  ulong uVar2;
  allocator<char> local_b9;
  ulong local_b8;
  string local_b0;
  string rspfile;
  string rspfile_content;
  string local_50;
  
  printf("\n  {\n    \"directory\": \"");
  EncodeJSONString(directory);
  printf("\",\n    \"command\": \"");
  Edge::EvaluateCommand_abi_cxx11_(&local_b0,edge,false);
  if (eval_mode != ECM_NORMAL) {
    Edge::GetUnescapedRspfile_abi_cxx11_(&rspfile,edge);
    if (rspfile._M_string_length != 0) {
      lVar1 = std::__cxx11::string::find((string *)&local_b0,(ulong)&rspfile);
      if ((1 < lVar1 + 1U) && (local_b0._M_dataplus._M_p[lVar1 + -1] == '@')) {
        local_b8 = lVar1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"rspfile_content",&local_b9);
        Edge::GetBinding(&rspfile_content,edge,&local_50);
        local_b8 = local_b8 - 1;
        std::__cxx11::string::~string((string *)&local_50);
        while( true ) {
          uVar2 = std::__cxx11::string::find((char)&rspfile_content,10);
          if (uVar2 == 0xffffffffffffffff) break;
          std::__cxx11::string::replace((ulong)&rspfile_content,uVar2,1,'\x01');
        }
        std::__cxx11::string::replace
                  ((ulong)&local_b0,local_b8,(string *)(rspfile._M_string_length + 1));
        std::__cxx11::string::~string((string *)&rspfile_content);
      }
    }
    std::__cxx11::string::~string((string *)&rspfile);
  }
  EncodeJSONString(local_b0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_b0);
  printf("\",\n    \"file\": \"");
  EncodeJSONString(((*(edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->path_)._M_dataplus._M_p);
  printf("\",\n    \"output\": \"");
  EncodeJSONString(((*(edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->path_)._M_dataplus._M_p);
  printf("\"\n  }");
  return;
}

Assistant:

void printCompdb(const char* const directory, const Edge* const edge,
                 const EvaluateCommandMode eval_mode) {
  printf("\n  {\n    \"directory\": \"");
  EncodeJSONString(directory);
  printf("\",\n    \"command\": \"");
  EncodeJSONString(EvaluateCommandWithRspfile(edge, eval_mode).c_str());
  printf("\",\n    \"file\": \"");
  EncodeJSONString(edge->inputs_[0]->path().c_str());
  printf("\",\n    \"output\": \"");
  EncodeJSONString(edge->outputs_[0]->path().c_str());
  printf("\"\n  }");
}